

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_WONDER(effect_handler_context_t *context)

{
  byte bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  effect_index local_c0 [2];
  effect_handler_context_t new_context;
  random_value_conflict value;
  effect_handler_f handler;
  wchar_t beam;
  wchar_t x;
  wchar_t y;
  wchar_t other;
  wchar_t radius;
  wchar_t subtype;
  wchar_t die;
  wchar_t plev;
  effect_handler_context_t *context_local;
  
  wVar2 = eff_level(player);
  wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  other = L'\0';
  y = L'\0';
  handler._0_4_ = context->beam;
  value.sides = L'\0';
  value.m_bonus = L'\0';
  memset(&new_context.cmd,0,0x10);
  context->ident = true;
  if (L'd' < wVar3) {
    msg("You feel a surge of power!");
  }
  if (wVar3 < L'\b') {
    other = L'3';
    value._8_8_ = effect_handler_BOLT;
  }
  else if (wVar3 < L'\x0e') {
    other = L'6';
    new_context.cmd._0_4_ = L'd';
    value._8_8_ = effect_handler_BOLT;
  }
  else if (wVar3 < L'\x1a') {
    other = L'5';
    new_context.cmd._4_4_ = L'\x04';
    value.base = L'\x06';
    value._8_8_ = effect_handler_BOLT;
  }
  else if (wVar3 < L'\x1f') {
    other = L'4';
    value._8_8_ = effect_handler_BOLT;
    new_context.cmd._0_4_ = wVar2;
  }
  else if (wVar3 < L'$') {
    handler._0_4_ = (wchar_t)handler + L'\xfffffff6';
    other = L'\x18';
    new_context.cmd._4_4_ = (wVar2 + L'\xffffffff') / 5 + L'\x03';
    value.base = L'\x04';
    value._8_8_ = effect_handler_BOLT_OR_BEAM;
  }
  else if (wVar3 < L')') {
    other = L'8';
    value._8_8_ = effect_handler_BOLT;
    new_context.cmd._0_4_ = wVar2;
  }
  else if (wVar3 < L'.') {
    other = L'\x04';
    new_context.cmd._0_4_ = wVar2 / 2 + L'\x14';
    y = L'\x03';
    value._8_8_ = effect_handler_BALL;
  }
  else if (wVar3 < L'3') {
    other = L'\x1c';
    new_context.cmd._4_4_ = L'\x06';
    value.base = L'\b';
    value._8_8_ = effect_handler_LINE;
  }
  else if (wVar3 < L'8') {
    other = L'\x01';
    new_context.cmd._4_4_ = (wVar2 + L'\xfffffffb') / 6 + L'\x03';
    value.base = L'\x06';
    value._8_8_ = effect_handler_BEAM;
  }
  else if (wVar3 < L'=') {
    handler._0_4_ = (wchar_t)handler + L'\xfffffff6';
    other = L'\x03';
    new_context.cmd._4_4_ = (wVar2 + L'\xfffffffb') / 4 + L'\x05';
    value.base = L'\b';
    value._8_8_ = effect_handler_BOLT_OR_BEAM;
  }
  else if (wVar3 < L'B') {
    other = L'\0';
    new_context.cmd._4_4_ = (wVar2 + L'\xfffffffb') / 4 + L'\x06';
    value.base = L'\b';
    value._8_8_ = effect_handler_BOLT_OR_BEAM;
  }
  else if (wVar3 < L'G') {
    other = L'\x02';
    new_context.cmd._4_4_ = (wVar2 + L'\xfffffffb') / 4 + L'\b';
    value.base = L'\b';
    value._8_8_ = effect_handler_BOLT_OR_BEAM;
  }
  else if (wVar3 < L'L') {
    other = L'<';
    new_context.cmd._0_4_ = L'K';
    value._8_8_ = effect_handler_BOLT;
  }
  else if (wVar3 < L'Q') {
    other = L'\x01';
    new_context.cmd._0_4_ = wVar2 / 2 + L'\x1e';
    y = L'\x02';
    value._8_8_ = effect_handler_BALL;
  }
  else if (wVar3 < L'V') {
    other = L'\0';
    new_context.cmd._0_4_ = wVar2 + L'(';
    y = L'\x02';
    value._8_8_ = effect_handler_BALL;
  }
  else if (wVar3 < L'[') {
    other = L'\x0e';
    new_context.cmd._0_4_ = wVar2 + L'F';
    y = L'\x03';
    value._8_8_ = effect_handler_BALL;
  }
  else if (wVar3 < L'`') {
    other = L'\x02';
    new_context.cmd._0_4_ = wVar2 + L'P';
    y = L'\x03';
    value._8_8_ = effect_handler_BALL;
  }
  else if (wVar3 < L'e') {
    other = L'<';
    new_context.cmd._0_4_ = wVar2 + L'd';
    value._8_8_ = effect_handler_BOLT;
  }
  else if (wVar3 < L'h') {
    y = L'\f';
    value._8_8_ = effect_handler_EARTHQUAKE;
  }
  else if (wVar3 < L'j') {
    y = L'\x0f';
    value._8_8_ = effect_handler_DESTRUCTION;
  }
  else if (wVar3 < L'l') {
    value._8_8_ = effect_handler_BANISH;
  }
  else if (wVar3 < L'n') {
    other = L'/';
    new_context.cmd._0_4_ = L'x';
    value._8_8_ = effect_handler_PROJECT_LOS;
  }
  if (value._8_8_ == 0) {
    origin._4_4_ = 0;
    origin.what = (context->origin).what;
    origin.which.trap = (context->origin).which.trap;
    effect_simple(L'3',origin,"150",L'/',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    origin_00._4_4_ = 0;
    origin_00.what = (context->origin).what;
    origin_00.which.trap = (context->origin).which.trap;
    effect_simple(L'3',origin_00,"20",L'7',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    origin_01._4_4_ = 0;
    origin_01.what = (context->origin).what;
    origin_01.which.trap = (context->origin).which.trap;
    effect_simple(L'3',origin_01,"40",L'2',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    origin_02._4_4_ = 0;
    origin_02.what = (context->origin).what;
    origin_02.which.trap = (context->origin).which.trap;
    effect_simple(L'\x03',origin_02,"300",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    context_local._7_1_ = true;
  }
  else {
    local_c0[0] = context->effect;
    new_context.effect = (context->origin).what;
    new_context._4_4_ = *(undefined4 *)&(context->origin).field_0x4;
    new_context.origin._0_8_ = (context->origin).which;
    new_context.origin.which = (anon_union_8_5_62f3dbed_for_which_conflict1)context->obj;
    new_context.obj._0_1_ = context->aware & 1;
    new_context.obj._4_4_ = context->dir;
    new_context._32_4_ = (wchar_t)handler;
    new_context.dir = context->boost;
    new_context.boost = new_context.cmd._4_4_;
    new_context.beam = (wchar_t)new_context.cmd;
    new_context.value.dice = value.dice;
    new_context.value.base = value.base;
    new_context.value.sides = other;
    new_context.value.m_bonus = y;
    new_context.subtype = L'\0';
    new_context.radius = L'\0';
    new_context.other = L'\0';
    new_context.x = L'\0';
    new_context._84_4_ = 0;
    new_context.msg._0_1_ = context->ident & 1;
    new_context._96_8_ = context->cmd;
    bVar1 = (*(code *)value._8_8_)(local_c0);
    context_local._7_1_ = (_Bool)(bVar1 & 1);
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_WONDER(effect_handler_context_t *context)
{
	int plev = eff_level(player);
	int die = effect_calculate_value(context, false);
	int subtype = 0, radius = 0, other = 0, y = 0, x = 0;
	int beam = context->beam;
	effect_handler_f handler = NULL;
	random_value value = { 0, 0, 0, 0 };

	context->ident = true;

	if (die > 100)
		msg("You feel a surge of power!");

	if (die < 8) {
		subtype = PROJ_MON_CLONE;
		handler = effect_handler_BOLT;
	} else if (die < 14) {
		subtype = PROJ_MON_SPEED;
		value.base = 100;
		handler = effect_handler_BOLT;
	} else if (die < 26) {
		subtype = PROJ_MON_HEAL;
		value.dice = 4;
		value.sides = 6;
		handler = effect_handler_BOLT;
	} else if (die < 31) {
		subtype = PROJ_MON_POLY;
		value.base = plev;
		handler = effect_handler_BOLT;
	} else if (die < 36) {
		beam -= 10;
		subtype = PROJ_MISSILE;
		value.dice = 3 + ((plev - 1) / 5);
		value.sides = 4;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 41) {
		subtype = PROJ_MON_CONF;
		value.base = plev;
		handler = effect_handler_BOLT;
	} else if (die < 46) {
		subtype = PROJ_POIS;
		value.base = 20 + plev / 2;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 51) {
		subtype = PROJ_LIGHT_WEAK;
		value.dice = 6;
		value.sides = 8;
		handler = effect_handler_LINE;
	} else if (die < 56) {
		subtype = PROJ_ELEC;
		value.dice = 3 + ((plev - 5) / 6);
		value.sides = 6;
		handler = effect_handler_BEAM;
	} else if (die < 61) {
		beam -= 10;
		subtype = PROJ_COLD;
		value.dice = 5 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 66) {
		subtype = PROJ_ACID;
		value.dice = 6 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 71) {
		subtype = PROJ_FIRE;
		value.dice = 8 + ((plev - 5) / 4);
		value.sides = 8;
		handler = effect_handler_BOLT_OR_BEAM;
	} else if (die < 76) {
		subtype = PROJ_MON_DRAIN;
		value.base = 75;
		handler = effect_handler_BOLT;
	} else if (die < 81) {
		subtype = PROJ_ELEC;
		value.base = 30 + plev / 2;
		radius = 2;
		handler = effect_handler_BALL;
	} else if (die < 86) {
		subtype = PROJ_ACID;
		value.base = 40 + plev;
		radius = 2;
		handler = effect_handler_BALL;
	} else if (die < 91) {
		subtype = PROJ_ICE;
		value.base = 70 + plev;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 96) {
		subtype = PROJ_FIRE;
		value.base = 80 + plev;
		radius = 3;
		handler = effect_handler_BALL;
	} else if (die < 101) {
		subtype = PROJ_MON_DRAIN;
		value.base = 100 + plev;
		handler = effect_handler_BOLT;
	} else if (die < 104) {
		radius = 12;
		handler = effect_handler_EARTHQUAKE;
	} else if (die < 106) {
		radius = 15;
		handler = effect_handler_DESTRUCTION;
	} else if (die < 108) {
		handler = effect_handler_BANISH;
	} else if (die < 110) {
		subtype = PROJ_DISP_ALL;
		value.base = 120;
		handler = effect_handler_PROJECT_LOS;
	}

	if (handler != NULL) {
		effect_handler_context_t new_context = {
			context->effect,
			context->origin,
			context->obj,
			context->aware,
			context->dir,
			beam,
			context->boost,
			value,
			subtype, radius, other, y, x,
			NULL,
			context->ident,
			context->cmd
		};

		return handler(&new_context);
	} else {
		/* RARE */
		effect_simple(EF_PROJECT_LOS, context->origin, "150", PROJ_DISP_ALL, 0, 0, 0, 0, NULL);
		effect_simple(EF_PROJECT_LOS, context->origin, "20", PROJ_MON_SLOW, 0, 0, 0, 0, NULL);
		effect_simple(EF_PROJECT_LOS, context->origin, "40", PROJ_SLEEP_ALL, 0, 0, 0, 0, NULL);
		effect_simple(EF_HEAL_HP, context->origin, "300", 0, 0, 0, 0, 0, NULL);

		return true;
	}
}